

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::GrowIndex(ImFont *this,int new_size)

{
  float *__src;
  unsigned_short *__src_00;
  int n;
  float *__dest;
  long lVar1;
  unsigned_short *__dest_00;
  int iVar2;
  int iVar3;
  
  iVar3 = (this->IndexAdvanceX).Size;
  if (iVar3 == (this->IndexLookup).Size) {
    if (iVar3 < new_size) {
      iVar2 = (this->IndexAdvanceX).Capacity;
      if (iVar2 < new_size) {
        if (iVar2 == 0) {
          iVar2 = 8;
        }
        else {
          iVar2 = iVar2 / 2 + iVar2;
        }
        if (iVar2 <= new_size) {
          iVar2 = new_size;
        }
        __dest = (float *)ImGui::MemAlloc((long)iVar2 << 2);
        __src = (this->IndexAdvanceX).Data;
        if (__src != (float *)0x0) {
          memcpy(__dest,__src,(long)(this->IndexAdvanceX).Size << 2);
          ImGui::MemFree((this->IndexAdvanceX).Data);
        }
        (this->IndexAdvanceX).Data = __dest;
        (this->IndexAdvanceX).Capacity = iVar2;
        iVar3 = (this->IndexAdvanceX).Size;
      }
      if (iVar3 < new_size) {
        lVar1 = (long)iVar3;
        do {
          (this->IndexAdvanceX).Data[lVar1] = -1.0;
          lVar1 = lVar1 + 1;
        } while (new_size != lVar1);
      }
      (this->IndexAdvanceX).Size = new_size;
      iVar3 = (this->IndexLookup).Capacity;
      if (iVar3 < new_size) {
        if (iVar3 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar3 / 2 + iVar3;
        }
        if (iVar3 <= new_size) {
          iVar3 = new_size;
        }
        __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar3 * 2);
        __src_00 = (this->IndexLookup).Data;
        if (__src_00 != (unsigned_short *)0x0) {
          memcpy(__dest_00,__src_00,(long)(this->IndexLookup).Size * 2);
          ImGui::MemFree((this->IndexLookup).Data);
        }
        (this->IndexLookup).Data = __dest_00;
        (this->IndexLookup).Capacity = iVar3;
      }
      iVar3 = (this->IndexLookup).Size;
      lVar1 = (long)iVar3;
      if (iVar3 < new_size) {
        do {
          (this->IndexLookup).Data[lVar1] = 0xffff;
          lVar1 = lVar1 + 1;
        } while (new_size != lVar1);
      }
      (this->IndexLookup).Size = new_size;
    }
    return;
  }
  __assert_fail("IndexAdvanceX.Size == IndexLookup.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                ,0xc8c,"void ImFont::GrowIndex(int)");
}

Assistant:

void ImFont::GrowIndex(int new_size)
{
    IM_ASSERT(IndexAdvanceX.Size == IndexLookup.Size);
    if (new_size <= IndexLookup.Size)
        return;
    IndexAdvanceX.resize(new_size, -1.0f);
    IndexLookup.resize(new_size, (ImWchar)-1);
}